

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall ymfm::ym2608::reset(ym2608 *this)

{
  ym2608 *this_local;
  
  fm_engine_base<ymfm::opn_registers_base<true>_>::reset
            ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
  ssg_engine::reset(&this->m_ssg);
  adpcm_a_engine::reset(&this->m_adpcm_a);
  adpcm_b_engine::reset(&this->m_adpcm_b);
  adpcm_a_engine::set_start_end(&this->m_adpcm_a,'\0',0,0x1bf);
  adpcm_a_engine::set_start_end(&this->m_adpcm_a,'\x01',0x1c0,0x43f);
  adpcm_a_engine::set_start_end(&this->m_adpcm_a,'\x02',0x440,0x1b7f);
  adpcm_a_engine::set_start_end(&this->m_adpcm_a,'\x03',0x1b80,0x1cff);
  adpcm_a_engine::set_start_end(&this->m_adpcm_a,'\x04',0x1d00,0x1f7f);
  adpcm_a_engine::set_start_end(&this->m_adpcm_a,'\x05',0x1f80,0x1fff);
  this->m_irq_enable = '\x1f';
  this->m_flag_control = '\x1c';
  read_status_hi(this);
  return;
}

Assistant:

void ym2608::reset()
{
	// reset the engines
	m_fm.reset();
	m_ssg.reset();
	m_adpcm_a.reset();
	m_adpcm_b.reset();

	// configure ADPCM percussion sounds; these are present in an embedded ROM
	m_adpcm_a.set_start_end(0, 0x0000, 0x01bf); // bass drum
	m_adpcm_a.set_start_end(1, 0x01c0, 0x043f); // snare drum
	m_adpcm_a.set_start_end(2, 0x0440, 0x1b7f); // top cymbal
	m_adpcm_a.set_start_end(3, 0x1b80, 0x1cff); // high hat
	m_adpcm_a.set_start_end(4, 0x1d00, 0x1f7f); // tom tom
	m_adpcm_a.set_start_end(5, 0x1f80, 0x1fff); // rim shot

	// initialize our special interrupt states, then read the upper status
	// register, which updates the IRQs
	m_irq_enable = 0x1f;
	m_flag_control = 0x1c;
	read_status_hi();
}